

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_long> *source,
               ArgMinMaxState<duckdb::hugeint_t,_long> *target,AggregateInputData *param_3)

{
  int64_t iVar1;
  
  if (((source->super_ArgMinMaxStateBase).is_initialized == true) &&
     (((target->super_ArgMinMaxStateBase).is_initialized != true || (target->value < source->value))
     )) {
    iVar1 = (source->arg).upper;
    (target->arg).lower = (source->arg).lower;
    (target->arg).upper = iVar1;
    target->value = source->value;
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}